

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLinLin>
               (TransformerLinLin transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImVec2 IVar1;
  double dVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  uchar *puVar5;
  ImU32 col;
  int iVar6;
  ImPlotContext *gp;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ImVec4 IVar21;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_100;
  double local_f8;
  uchar *local_f0;
  ImDrawList *local_e8;
  ulong local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  char *local_90;
  long local_88;
  ImVec2 local_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [12];
  float fStack_4c;
  
  pIVar4 = GImPlot;
  if (0 < rows) {
    auVar15._0_8_ = (double)cols;
    auVar15._8_8_ = (double)rows;
    auVar14._0_8_ = bounds_max->x - bounds_min->x;
    auVar14._8_8_ = bounds_max->y - bounds_min->y;
    auVar15 = divpd(auVar14,auVar15);
    dVar13 = auVar15._0_8_;
    dVar16 = dVar13 * 0.5;
    local_78 = auVar15._8_8_;
    dVar17 = local_78 * 0.5;
    lVar7 = (long)transformer.YAxis;
    dVar11 = scale_max - scale_min;
    local_e0 = (ulong)(uint)cols;
    iVar6 = 0;
    local_f8 = local_78 * 0.5;
    dVar19 = 0.0;
    iVar8 = 0;
    local_f0 = values;
    local_e8 = DrawList;
    local_d8 = scale_min;
    local_d0 = dVar11;
    local_c8 = dVar16;
    dStack_c0 = dVar17;
    local_90 = fmt;
    dStack_70 = local_78;
    local_68 = auVar15;
    do {
      if (0 < cols) {
        local_a8 = local_78 * dVar19 + local_f8;
        local_b8._0_8_ = local_f0 + iVar6;
        dVar20 = 0.0;
        lVar10 = 0;
        do {
          dVar18 = dVar20 * auVar15._0_8_ + bounds_min->x + dVar13 * 0.5;
          dVar12 = bounds_max->y - local_a8;
          pIVar3 = GImPlot->CurrentPlot;
          IVar1 = GImPlot->PixelRange[lVar7].Min;
          dVar2 = (pIVar3->XAxis).Range.Min;
          local_100.x = (float)(GImPlot->Mx * ((dVar18 - dVar16) - dVar2) + (double)IVar1.x);
          local_100.y = (float)(GImPlot->My[lVar7] *
                                ((dVar12 - dVar17) - pIVar3->YAxis[lVar7].Range.Min) +
                               (double)IVar1.y);
          IVar1 = GImPlot->PixelRange[lVar7].Min;
          local_80.x = (float)(GImPlot->Mx * ((dVar16 + dVar18) - dVar2) + (double)IVar1.x);
          local_80.y = (float)(GImPlot->My[lVar7] *
                               ((dVar17 + dVar12) - pIVar3->YAxis[lVar7].Range.Min) +
                              (double)IVar1.y);
          IVar21 = LerpColormap((float)(((double)*(byte *)(local_b8._0_8_ + lVar10) - scale_min) /
                                        dVar11 + 0.0));
          local_58 = IVar21._0_12_;
          fStack_4c = IVar21.w * (pIVar4->Style).FillAlpha;
          col = ImGui::GetColorU32((ImVec4 *)local_58);
          ImDrawList::AddRectFilled(DrawList,&local_100,&local_80,col,0.0,0xf);
          dVar20 = dVar20 + 1.0;
          lVar10 = lVar10 + 1;
          dVar11 = local_d0;
          auVar15 = local_68;
          dVar16 = local_c8;
          dVar17 = dStack_c0;
          scale_min = local_d8;
        } while ((int)local_e0 != (int)lVar10);
        iVar6 = iVar6 + (int)lVar10;
        fmt = local_90;
      }
      dVar19 = dVar19 + 1.0;
      iVar8 = iVar8 + 1;
    } while (iVar8 != rows);
    if (fmt != (char *)0x0 && 0 < rows) {
      dVar11 = auVar15._0_8_;
      iVar6 = 0;
      dVar16 = 0.0;
      iVar8 = 0;
      lVar10 = lVar7;
      local_88 = lVar7;
      do {
        puVar5 = local_f0;
        if (0 < cols) {
          local_c8 = local_78 * dVar16 + local_f8;
          dVar17 = 0.0;
          lVar9 = 0;
          do {
            IVar1 = GImPlot->PixelRange[lVar7].Min;
            local_a8._0_4_ =
                 (float)(GImPlot->Mx *
                         ((dVar17 * auVar15._0_8_ + bounds_min->x + dVar11 * 0.5) -
                         (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
            local_a8._4_4_ =
                 (float)(GImPlot->My[lVar10] *
                         (((bounds_min->y + 1.0) - local_c8) -
                         GImPlot->CurrentPlot->YAxis[lVar7].Range.Min) + (double)IVar1.y);
            uStack_a0 = 0;
            sprintf(local_58,fmt,(ulong)puVar5[lVar9 + iVar6]);
            IVar1 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
            local_b8._8_4_ = extraout_XMM0_Dc;
            local_b8._0_4_ = IVar1.x;
            local_b8._4_4_ = IVar1.y;
            local_b8._12_4_ = extraout_XMM0_Dd;
            IVar21 = LerpColormap((float)(((double)puVar5[lVar9 + iVar6] - local_d8) / local_d0 +
                                         0.0));
            local_100.y = (float)local_b8._4_4_ * -0.5 + local_a8._4_4_;
            local_100.x = (float)local_b8._0_4_ * -0.5 + (float)local_a8;
            ImDrawList::AddText(local_e8,&local_100,
                                -(uint)(IVar21.z * 0.114 + IVar21.x * 0.299 + IVar21.y * 0.587 <=
                                       0.5) | 0xff000000,local_58,(char *)0x0);
            dVar17 = dVar17 + 1.0;
            lVar9 = lVar9 + 1;
            lVar10 = local_88;
            auVar15 = local_68;
          } while ((int)local_e0 != (int)lVar9);
          iVar6 = iVar6 + (int)lVar9;
        }
        dVar16 = dVar16 + 1.0;
        iVar8 = iVar8 + 1;
      } while (iVar8 != rows);
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}